

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall setup::message_entry::load(message_entry *this,istream *is,info *i)

{
  bool bVar1;
  int iVar2;
  vector<setup::language_entry,_std::allocator<setup::language_entry>_> *this_00;
  vector<setup::language_entry,_std::allocator<setup::language_entry>_> *pvVar3;
  long in_RDX;
  string *in_RDI;
  uint32_t codepage;
  undefined4 in_stack_fffffffffffffdf8;
  log_level in_stack_fffffffffffffdfc;
  istream *in_stack_fffffffffffffe00;
  logger *this_01;
  bitset<256UL> *in_stack_fffffffffffffe30;
  codepage_id in_stack_fffffffffffffe3c;
  string *in_stack_fffffffffffffe40;
  logger *in_stack_ffffffffffffff30;
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>> local_38 [8];
  encoded_string local_30;
  long local_18;
  
  local_18 = in_RDX;
  util::encoded_string::encoded_string(&local_30,in_RDI,*(codepage_id *)(in_RDX + 0x18));
  util::operator>>(in_stack_fffffffffffffe00,
                   (encoded_string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  boost::unordered::iterator_detail::
  iterator<boost::unordered::detail::ptr_node<std::pair<unsigned_int_const,void*>>>::iterator
            (local_38,(slice_reader *)(in_RDI + 1));
  util::operator>>(in_stack_fffffffffffffe00,
                   (binary_string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  iVar2 = util::load<int>((istream *)0x188a15);
  *(int *)(in_RDI + 2) = iVar2;
  if (-1 < *(int *)(in_RDI + 2)) {
    this_00 = (vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
              (long)*(int *)(in_RDI + 2);
    pvVar3 = (vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
             std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::size
                       ((vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
                        (local_18 + 0x760));
    if (pvVar3 <= this_00) {
      bVar1 = std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::empty
                        (this_00);
      if (!bVar1) {
        this_01 = (logger *)&stack0xfffffffffffffe40;
        logger::logger(this_01,in_stack_fffffffffffffdfc);
        logger::operator<<(this_01,(char (*) [10])
                                   CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        logger::operator<<(this_01,(int *)CONCAT44(in_stack_fffffffffffffdfc,
                                                   in_stack_fffffffffffffdf8));
        logger::~logger(in_stack_ffffffffffffff30);
      }
      std::__cxx11::string::clear();
      return;
    }
    std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::operator[]
              ((vector<setup::language_entry,_std::allocator<setup::language_entry>_> *)
               (local_18 + 0x760),(long)*(int *)(in_RDI + 2));
  }
  util::to_utf8(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30);
  return;
}

Assistant:

void message_entry::load(std::istream & is, const info & i) {
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::binary_string(value);
	
	language = util::load<boost::int32_t>(is);
	
	boost::uint32_t codepage;
	if(language < 0) {
		codepage = i.codepage;
	} else if(size_t(language) >= i.languages.size()) {
		if(!i.languages.empty()) {
			log_warning << "Language index out of bounds: " << language;
		}
		value.clear();
		return;
	} else {
		codepage = i.languages[size_t(language)].codepage;
	}
	
	util::to_utf8(value, codepage);
}